

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

int dlep_extension_radio_write_session_update
              (dlep_extension *ext,dlep_session *session,oonf_layer2_neigh_key *neigh)

{
  char *key;
  uint uVar1;
  avl_tree *tree;
  avl_node *paVar2;
  int line;
  oonf_log_source source;
  ulong uVar3;
  
  key = (session->l2_listener).name;
  tree = oonf_layer2_get_net_tree();
  paVar2 = avl_find(tree,key);
  if (paVar2 == (avl_node *)0x0) {
    if ((log_global_mask[session->log_source] & 4) == 0) {
      return -1;
    }
    oonf_log(LOG_SEVERITY_WARN,session->log_source,"src/generic/dlep/dlep_extension.c",0x163,
             (void *)0x0,0,"Could not find l2net for new interface");
    return -1;
  }
  uVar1 = dlep_writer_map_l2neigh_data
                    (&session->writer,ext,(oonf_layer2_data *)&paVar2[-0x13].left,
                     (oonf_layer2_data *)0x0);
  if (uVar1 == 0) {
    uVar1 = dlep_writer_map_l2net_data(&session->writer,ext,(oonf_layer2_data *)(paVar2 + -0x1e));
    if (uVar1 == 0) {
      return 0;
    }
    uVar3 = (ulong)uVar1;
    source = session->log_source;
    if ((log_global_mask[source] & 4) == 0) goto LAB_0013fe41;
    uVar1 = ext->id;
    line = 0x16f;
  }
  else {
    uVar3 = (ulong)uVar1;
    source = session->log_source;
    if ((log_global_mask[source] & 4) == 0) goto LAB_0013fe41;
    uVar1 = ext->id;
    line = 0x169;
  }
  oonf_log(LOG_SEVERITY_WARN,source,"src/generic/dlep/dlep_extension.c",line,(void *)0x0,0,
           "tlv mapping for extension %d failed: %d",(ulong)uVar1,uVar3);
LAB_0013fe41:
  return (int)uVar3;
}

Assistant:

int
dlep_extension_radio_write_session_update(
  struct dlep_extension *ext, struct dlep_session *session, const struct oonf_layer2_neigh_key *neigh __attribute__((unused))) {
  struct oonf_layer2_net *l2net;
  int result;

  l2net = oonf_layer2_net_get(session->l2_listener.name);
  if (!l2net) {
    OONF_WARN(session->log_source, "Could not find l2net for new interface");
    return -1;
  }

  result = dlep_writer_map_l2neigh_data(&session->writer, ext, l2net->neighdata, NULL);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }

  result = dlep_writer_map_l2net_data(&session->writer, ext, l2net->data);
  if (result) {
    OONF_WARN(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return result;
  }
  return 0;
}